

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtzobj.cpp
# Opt level: O3

int __thiscall
CVmObjTimeZone::getp_getLocation(CVmObjTimeZone *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  CVmObjPageEntry *this_00;
  long lVar1;
  char *__s;
  anon_union_8_8_cb74652f_for_val aVar2;
  undefined4 uVar3;
  vm_val_t *pvVar4;
  int iVar5;
  vm_obj_id_t vVar6;
  size_t sVar7;
  ulong uVar8;
  byte *bytelen;
  long lVar9;
  byte *__s_00;
  vm_val_t ele;
  vm_val_t local_40;
  
  if (oargc == (uint *)0x0) {
    lVar9 = 1;
  }
  else {
    lVar9 = (long)(int)(*oargc + 1);
  }
  if (getp_getLocation(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_getLocation();
  }
  iVar5 = CVmObject::get_prop_check_argc(retval,oargc,&getp_getLocation::desc);
  if (iVar5 == 0) {
    lVar1 = *(long *)(this->super_CVmObject).ext_;
    vVar6 = CVmObjList::create(0,4);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar6;
    pvVar4 = sp_;
    this_00 = G_obj_table_X.pages_[vVar6 >> 0xc] + (vVar6 & 0xfff);
    uVar3 = *(undefined4 *)&retval->field_0x4;
    aVar2 = retval->val;
    sp_ = sp_ + 1;
    pvVar4->typ = retval->typ;
    *(undefined4 *)&pvVar4->field_0x4 = uVar3;
    pvVar4->val = aVar2;
    uVar8 = (ulong)**(ushort **)((long)&this_00->ptr_ + 8);
    if (uVar8 != 0) {
      CVmObjList::cons_clear((CVmObjList *)this_00,0,uVar8 - 1);
    }
    sVar7 = strlen((char *)(lVar1 + 0x48));
    local_40.val.obj = CVmObjString::create(0,(char *)(lVar1 + 0x48),sVar7);
    local_40.typ = VM_OBJ;
    CVmObjList::cons_set_element((CVmObjList *)this_00,0,&local_40);
    if ((*(char *)(lVar1 + 0x4b) == '-') ||
       (__s_00 = (byte *)(lVar1 + 0x4b), *(char *)(lVar1 + 0x4b) == '+')) {
      __s_00 = (byte *)(lVar1 + 0x4c);
    }
    bytelen = __s_00 + (-0x4b - lVar1);
    while ((0x2d < (ulong)*__s_00 || ((0x280000000001U >> ((ulong)*__s_00 & 0x3f) & 1) == 0))) {
      __s_00 = __s_00 + 1;
      bytelen = bytelen + 1;
    }
    local_40.val.obj = CVmObjString::create(0,(char *)(lVar1 + 0x4b),(size_t)bytelen);
    local_40.typ = VM_OBJ;
    CVmObjList::cons_set_element((CVmObjList *)this_00,1,&local_40);
    sVar7 = strlen((char *)__s_00);
    local_40.val.obj = CVmObjString::create(0,(char *)__s_00,sVar7);
    local_40.typ = VM_OBJ;
    CVmObjList::cons_set_element((CVmObjList *)this_00,2,&local_40);
    __s = *(char **)(lVar1 + 0x60);
    if ((__s == (char *)0x0) || (*__s == '\0')) {
      local_40.typ = VM_NIL;
    }
    else {
      sVar7 = strlen(__s);
      local_40.val.obj = CVmObjString::create(0,__s,sVar7);
      local_40.typ = VM_OBJ;
    }
    CVmObjList::cons_set_element((CVmObjList *)this_00,3,&local_40);
    sp_ = sp_ + -lVar9;
  }
  return 1;
}

Assistant:

int CVmObjTimeZone::getp_getLocation(VMG_ vm_obj_id_t self,
                                     vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get our underlying CVmTimeZone object */
    CVmTimeZone *tz = get_ext()->tz;

    /* create the return list - [country, lat, long, desc] */
    retval->set_obj(CVmObjList::create(vmg_ FALSE, 4));
    CVmObjList *lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);
    G_stk->push(retval);
    lst->cons_clear();

    /* set the country string */
    vm_val_t ele;
    const char *str = tz->country();
    ele.set_obj(CVmObjString::create(vmg_ FALSE, str, strlen(str)));
    lst->cons_set_element(0, &ele);

    /* get the lat/long string */
    str = tz->coords();

    /* find the +/- that separates the lat/long portions */
    const char *p = str;
    if (*p == '+' || *p == '-')
        ++p;
    for ( ; *p != '\0' && *p != '-' && *p != '+' ; ++p) ;

    /* set the two substrings */
    ele.set_obj(CVmObjString::create(vmg_ FALSE, str, p - str));
    lst->cons_set_element(1, &ele);
    ele.set_obj(CVmObjString::create(vmg_ FALSE, p, strlen(p)));
    lst->cons_set_element(2, &ele);

    /* set the description string */
    str = tz->desc();
    if (str != 0 && str[0] != '\0')
        ele.set_obj(CVmObjString::create(vmg_ FALSE, str, strlen(str)));
    else
        ele.set_nil();
    lst->cons_set_element(3, &ele);

    /* discard arguments and gc protection */
    G_stk->discard(argc + 1);

    /* handled */
    return TRUE;
}